

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mod2sparse_extra.c
# Opt level: O0

void LU_forward_backward_solve(mod2sparse *L,mod2sparse *U,int *rows,int *cols,char *z,char *x)

{
  int iVar1;
  void *__ptr;
  char *in_RCX;
  char *in_RDX;
  int *in_RSI;
  mod2sparse *in_RDI;
  long in_R9;
  int bit_no;
  char *forward_b;
  int R;
  int N;
  int local_44;
  undefined8 in_stack_ffffffffffffffc0;
  
  iVar1 = in_RSI[1];
  __ptr = chk_alloc((uint)((ulong)in_stack_ffffffffffffffc0 >> 0x20),(uint)in_stack_ffffffffffffffc0
                   );
  for (local_44 = 0; local_44 < iVar1; local_44 = local_44 + 1) {
    *(undefined1 *)(in_R9 + local_44) = 0;
  }
  mod2sparse_forward_sub(in_RDI,in_RSI,in_RDX,in_RCX);
  mod2sparse_backward_sub(in_RDI,in_RSI,in_RDX,in_RCX);
  free(__ptr);
  return;
}

Assistant:

void LU_forward_backward_solve
        (mod2sparse *L,
         mod2sparse *U,
         int *rows,
         int *cols,
         char *z,
         char *x)
{
    int N,R;
    char *forward_b;
    N=mod2sparse_cols(U);
    R=mod2sparse_cols(L);
    forward_b=chk_alloc(R,sizeof(*forward_b));

    for(int bit_no=0;bit_no<N;bit_no++) x[bit_no]=0;

    mod2sparse_forward_sub
            ( L,	/* Matrix that is lower triangular after reordering */
              rows,		/* Array of indexes (from 0) of rows for new order */
              z,		/* Vector on right of equation, also reordered */
              forward_b		/* Place to store solution */
            );
    mod2sparse_backward_sub
            ( U,	/* Matrix that is lower triangular after reordering */
              cols,		/* Array of indexes (from 0) of cols for new order */
              forward_b,		/* Vector on right of equation, also reordered */
              x		/* Place to store solution */
            );
    free(forward_b);
}